

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_appender_api.cpp
# Opt level: O2

void TestAppendingSingleDecimalValue<int>
               (int value,Value *expected_result,uint8_t width,uint8_t scale)

{
  StringRef capturedExpression;
  _Head_base<0UL,_duckdb::Appender_*,_false> _Var1;
  _Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_> _Var2;
  char *pcVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  type args;
  type args_00;
  pointer pAVar6;
  uchar params_1;
  initializer_list<duckdb::Value> __l;
  ExprLhs<bool> local_159;
  _Head_base<0UL,_duckdb::Appender_*,_false> local_158;
  allocator local_149;
  _Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_> local_148;
  templated_unique_single_t conn;
  SourceLineInfo local_138;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_128;
  templated_unique_single_t db;
  AssertionHandler catchAssertionHandler;
  string local_c8 [2];
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_88;
  string local_70 [32];
  StringRef local_50;
  StringRef local_40;
  
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x0;
  duckdb::make_uniq<duckdb::DuckDB,decltype(nullptr)>((void **)&db);
  args = duckdb::unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator*
                   (&db);
  duckdb::make_uniq<duckdb::Connection,duckdb::DuckDB&>((duckdb *)&conn,args);
  local_158._M_head_impl = (Appender *)0x0;
  local_148.super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::QueryResult_*,_false>)(QueryResult *)0x0;
  local_c8[0]._M_dataplus._M_p = "REQUIRE";
  local_c8[0]._M_string_length = 7;
  local_138.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_appender_api.cpp"
  ;
  local_138.line = 0xf;
  Catch::StringRef::StringRef
            (&local_40,
             "NO_FAIL((conn->Query(StringUtil::Format(\"CREATE TABLE decimals(i DECIMAL(%d,%d))\", width, scale))))"
            );
  capturedExpression.m_size = local_40.m_size;
  capturedExpression.m_start = local_40.m_start;
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)local_c8,&local_138,capturedExpression,Normal);
  params_1 = (uchar)local_40.m_size;
  duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
            (&conn);
  std::__cxx11::string::string(local_70,"CREATE TABLE decimals(i DECIMAL(%d,%d))",&local_149);
  duckdb::Exception::ConstructMessage<unsigned_char,unsigned_char>
            (local_c8,(Exception *)local_70,(string *)(ulong)width,scale,params_1);
  duckdb::Connection::Query((string *)&local_138);
  local_128._M_head_impl = (QueryResult *)local_138.file;
  local_138.file = (char *)0x0;
  local_159.m_lhs =
       duckdb::NO_FAIL((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                        *)&local_128);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,&local_159);
  if (local_128._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)local_128._M_head_impl + 8))();
  }
  local_128._M_head_impl = (QueryResult *)0x0;
  if ((long *)local_138.file != (long *)0x0) {
    (**(code **)(*(long *)local_138.file + 8))();
  }
  local_138.file = (char *)0x0;
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string(local_70);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  args_00 = duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
            operator*(&conn);
  duckdb::make_uniq<duckdb::Appender,duckdb::Connection&,char_const(&)[9]>
            ((duckdb *)&catchAssertionHandler,args_00,(char (*) [9])0x43e4a5);
  pcVar3 = catchAssertionHandler.m_assertionInfo.macroName.m_start;
  _Var1._M_head_impl = local_158._M_head_impl;
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x0;
  local_158._M_head_impl = (Appender *)pcVar3;
  if (_Var1._M_head_impl != (Appender *)0x0) {
    (**(code **)(*(long *)_Var1._M_head_impl + 8))();
    if (catchAssertionHandler.m_assertionInfo.macroName.m_start != (char *)0x0) {
      (**(code **)(*(long *)catchAssertionHandler.m_assertionInfo.macroName.m_start + 8))();
    }
  }
  duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::operator->
            ((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)&local_158
            );
  duckdb::BaseAppender::BeginRow();
  pAVar6 = duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::
           operator->((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
                      &local_158);
  duckdb::BaseAppender::Append<int>((int)pAVar6);
  duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::operator->
            ((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)&local_158
            );
  duckdb::BaseAppender::EndRow();
  duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::operator->
            ((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)&local_158
            );
  duckdb::BaseAppender::Flush();
  duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
            (&conn);
  std::__cxx11::string::string
            ((string *)&catchAssertionHandler,"SELECT * FROM decimals",(allocator *)&local_138);
  duckdb::Connection::Query((string *)local_c8);
  _Var4._M_p = local_c8[0]._M_dataplus._M_p;
  _Var2.super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl =
       local_148.super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl;
  local_c8[0]._M_dataplus._M_p = (pointer)0x0;
  local_148.super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::QueryResult_*,_false>)
       (_Head_base<0UL,_duckdb::QueryResult_*,_false>)_Var4._M_p;
  if (_Var2.super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl != (QueryResult *)0x0)
  {
    (**(code **)(*(long *)_Var2.super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl + 8
                ))();
    if ((long *)local_c8[0]._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_c8[0]._M_dataplus._M_p + 8))();
    }
  }
  local_c8[0]._M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::~string((string *)&catchAssertionHandler);
  local_c8[0]._M_dataplus._M_p = "REQUIRE";
  local_c8[0]._M_string_length = 7;
  local_138.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_appender_api.cpp"
  ;
  local_138.line = 0x19;
  Catch::StringRef::StringRef(&local_50,"CHECK_COLUMN(result, 0, {expected_result})");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)local_c8,&local_138,local_50,Normal);
  duckdb::Value::Value((Value *)local_c8,expected_result);
  __l._M_len = 1;
  __l._M_array = (iterator)local_c8;
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            (&local_88,__l,(allocator_type *)&local_159);
  bVar5 = duckdb::CHECK_COLUMN
                    ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                      *)&local_148,0,(vector<duckdb::Value,_true> *)&local_88);
  local_138.file = (char *)CONCAT71(local_138.file._1_7_,bVar5);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_138);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_88);
  duckdb::Value::~Value((Value *)local_c8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  if (local_148.super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl !=
      (QueryResult *)0x0) {
    (**(code **)(*(long *)local_148.super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl
                + 8))();
  }
  if (local_158._M_head_impl != (Appender *)0x0) {
    (**(code **)(*(long *)local_158._M_head_impl + 8))();
  }
  std::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>_>::~unique_ptr
            (&conn.super_unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>_>);
  std::unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>::~unique_ptr
            (&db.super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>);
  return;
}

Assistant:

void TestAppendingSingleDecimalValue(SRC value, Value expected_result, uint8_t width, uint8_t scale) {
	auto db = make_uniq<DuckDB>(nullptr);
	auto conn = make_uniq<Connection>(*db);
	duckdb::unique_ptr<Appender> appender;
	duckdb::unique_ptr<QueryResult> result;
	REQUIRE_NO_FAIL(conn->Query(StringUtil::Format("CREATE TABLE decimals(i DECIMAL(%d,%d))", width, scale)));
	appender = make_uniq<Appender>(*conn, "decimals");

	appender->BeginRow();
	appender->Append<SRC>(value);
	appender->EndRow();

	appender->Flush();

	result = conn->Query("SELECT * FROM decimals");
	REQUIRE(CHECK_COLUMN(result, 0, {expected_result}));
}